

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Value * __thiscall cashew::Value::setString(Value *this,char *s)

{
  IString local_30;
  
  free(this,s);
  this->type = String;
  ::wasm::IString::IString(&local_30,s);
  (this->field_1).str.str._M_len = local_30.str._M_len;
  (this->field_1).str.str._M_str = local_30.str._M_str;
  return this;
}

Assistant:

Value& setString(const char* s) {
    free();
    type = String;
    str = IString(s);
    return *this;
  }